

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O0

void av1_derive_flags_for_lr_processing(LOOP_FILTER_SPEED_FEATURES *lpf_sf,_Bool *disable_lr_filter)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool local_14;
  _Bool local_13;
  _Bool is_sgr_disabled;
  _Bool is_wiener_disabled;
  _Bool *disable_lr_filter_local;
  LOOP_FILTER_SPEED_FEATURES *lpf_sf_local;
  
  _Var1 = (_Bool)(lpf_sf->disable_wiener_filter & 1);
  _Var2 = (_Bool)(lpf_sf->disable_sgr_filter & 1);
  local_13 = false;
  if (_Var1 != false) {
    local_13 = _Var2;
  }
  *disable_lr_filter = local_13;
  disable_lr_filter[1] = _Var1;
  disable_lr_filter[2] = _Var2;
  local_14 = true;
  if (_Var1 == false) {
    local_14 = _Var2;
  }
  disable_lr_filter[3] = local_14;
  return;
}

Assistant:

static inline void av1_derive_flags_for_lr_processing(
    const LOOP_FILTER_SPEED_FEATURES *lpf_sf, bool *disable_lr_filter) {
  const bool is_wiener_disabled = lpf_sf->disable_wiener_filter;
  const bool is_sgr_disabled = lpf_sf->disable_sgr_filter;

  // Enable None Loop restoration filter if either of Wiener or Self-guided is
  // enabled.
  disable_lr_filter[RESTORE_NONE] = (is_wiener_disabled && is_sgr_disabled);

  disable_lr_filter[RESTORE_WIENER] = is_wiener_disabled;
  disable_lr_filter[RESTORE_SGRPROJ] = is_sgr_disabled;

  // Enable Swicthable Loop restoration filter if both of the Wiener and
  // Self-guided are enabled.
  disable_lr_filter[RESTORE_SWITCHABLE] =
      (is_wiener_disabled || is_sgr_disabled);
}